

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

double __thiscall
mp::internal::BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
          (BinaryReader<mp::internal::EndiannessConverter> *this)

{
  char *pcVar1;
  undefined8 *in_RDI;
  double dVar2;
  BinaryReaderBase *unaff_retaddr;
  double val;
  
  in_RDI[3] = *in_RDI;
  pcVar1 = BinaryReaderBase::Read(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  dVar2 = EndiannessConverter::Convert<double>(*(EndiannessConverter **)pcVar1,(double)in_RDI);
  return dVar2;
}

Assistant:

double ReadDouble() {
    token_ = ptr_;
    double val;
    memcpy(&val, Read(sizeof(double)), sizeof(double));
    return this->Convert(val);
  }